

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O2

PAL_ERROR PrepareStandardHandle(CPalThread *pThread,HANDLE hFile,IPalObject **ppobjFile,int *piFd)

{
  PAL_ERROR PVar1;
  int iVar2;
  undefined8 *local_38;
  long local_30;
  CFileProcessLocalData *pLocalData;
  
  local_38 = (undefined8 *)0x0;
  local_30 = 0;
  PVar1 = (**(code **)(*CorUnix::g_pObjectManager + 0x28))
                    (CorUnix::g_pObjectManager,pThread,hFile,CorUnix::aotFile,0);
  if (PVar1 == 0) {
    PVar1 = (**(code **)(lRam0000000000000000 + 0x18))(0,pThread,0,&local_38,&local_30);
    if (PVar1 == 0) {
      if ((*(int *)(local_30 + 0x1018) != 0) &&
         (iVar2 = fcntl64(*(undefined4 *)(local_30 + 8),2,0), iVar2 != -1)) {
        *piFd = *(int *)(local_30 + 8);
        (**(code **)*local_38)(local_38,pThread,0);
        *ppobjFile = (IPalObject *)0x0;
        return 0;
      }
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0013f21c;
      PVar1 = 6;
    }
    else {
      fprintf(_stderr,"] %s %s:%d","PrepareStandardHandle",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
              ,0x1ba);
      fprintf(_stderr,"Unable to access file data\n");
    }
  }
  else if (PAL_InitializeChakraCoreCalled == false) {
LAB_0013f21c:
    abort();
  }
  if (local_38 != (undefined8 *)0x0) {
    (**(code **)*local_38)(local_38,pThread,0);
  }
  return PVar1;
}

Assistant:

PAL_ERROR
PrepareStandardHandle(
    CPalThread *pThread,
    HANDLE hFile,
    IPalObject **ppobjFile,
    int *piFd
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjFile = NULL;
    IDataLock *pDataLock = NULL;
    CFileProcessLocalData *pLocalData = NULL;
    int iError = 0;

    palError = g_pObjectManager->ReferenceObjectByHandle(
        pThread,
        hFile,
        &aotFile,
        0,
        &pobjFile
        );

    if (NO_ERROR != palError)
    {
        ERROR("Bad handle passed through CreateProcess\n");
        goto PrepareStandardHandleExit;
    }

    palError = pobjFile->GetProcessLocalData(
        pThread,
        ReadLock,
        &pDataLock,
        reinterpret_cast<void **>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        ASSERT("Unable to access file data\n");
        goto PrepareStandardHandleExit;
    }

    //
    // The passed in file needs to be inheritable
    //

    if (!pLocalData->inheritable)
    {
        ERROR("Non-inheritable handle passed through CreateProcess\n");
        palError = ERROR_INVALID_HANDLE;
        goto PrepareStandardHandleExit;
    }

    iError = fcntl(pLocalData->unix_fd, F_SETFD, 0);
    if (-1 == iError)
    {
        ERROR("Unable to remove close-on-exec for file (errno %i)\n", errno);
        palError = ERROR_INVALID_HANDLE;
        goto PrepareStandardHandleExit;
    }

    *piFd = pLocalData->unix_fd;
    pDataLock->ReleaseLock(pThread, FALSE);
    pDataLock = NULL;

    //
    // Transfer pobjFile reference to out parameter
    //

    *ppobjFile = pobjFile;
    pobjFile = NULL;

PrepareStandardHandleExit:

    if (NULL != pDataLock)
    {
        pDataLock->ReleaseLock(pThread, FALSE);
    }

    if (NULL != pobjFile)
    {
        pobjFile->ReleaseReference(pThread);
    }

    return palError;
}